

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-helpers.c++
# Opt level: O2

void __thiscall
kj::_::LogExpectation::logMessage
          (LogExpectation *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  bool bVar1;
  
  if ((this->seen == false) && (this->severity == severity)) {
    bVar1 = String::contains(text,&this->substring);
    if (bVar1) {
      this->seen = true;
      return;
    }
  }
  ExceptionCallback::logMessage(&this->super_ExceptionCallback,severity,file,line,contextDepth,text)
  ;
  return;
}

Assistant:

void LogExpectation::logMessage(
    LogSeverity severity, const char* file, int line, int contextDepth,
    String&& text) {
  if (!seen && severity == this->severity) {
    if (text.contains(substring)) {
      // Match. Ignore it.
      seen = true;
      return;
    }
  }

  // Pass up the chain.
  ExceptionCallback::logMessage(severity, file, line, contextDepth, kj::mv(text));
}